

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

bool __thiscall flexbuffers::Verifier::VerifyRef(Verifier *this,Reference r)

{
  Reference r_00;
  Reference r_01;
  bool bVar1;
  Type TVar2;
  ulong uVar3;
  uint8_t *p;
  size_t o;
  ulong uVar4;
  bool bVar6;
  Reference r_02;
  Reference r_local;
  uint8_t len;
  undefined7 uStack_37;
  size_t local_28;
  undefined8 uVar5;
  
  r_local.data_ = r.data_;
  r_local.parent_width_ = r.parent_width_;
  r_local.byte_width_ = r.byte_width_;
  r_local._10_2_ = r._10_2_;
  r_local.type_ = r.type_;
  if (8 < r_local.byte_width_) {
    return false;
  }
  if ((0x116U >> (r._9_4_ & 0x1f) & 1) == 0) {
    return false;
  }
  if (FBT_VECTOR_BOOL < r_local.type_) goto LAB_00149730;
  if ((r_local.type_ < (FBT_BOOL|FBT_INT)) &&
     ((0x400000fU >> (r_local.type_ & (FBT_VECTOR_FLOAT4|FBT_INDIRECT_UINT)) & 1) != 0)) {
    return true;
  }
  if (r_local.parent_width_ < 4) {
    if (r_local.parent_width_ < 2) {
      uVar3 = (ulong)(byte)*(ulong *)r_local.data_;
    }
    else {
      uVar3 = (ulong)(ushort)*(ulong *)r_local.data_;
    }
  }
  else if (r_local.parent_width_ < 8) {
    uVar3 = (ulong)(uint)*(ulong *)r_local.data_;
  }
  else {
    uVar3 = *(ulong *)r_local.data_;
  }
  if (this->size_ < uVar3) {
    return false;
  }
  if ((ulong)((long)r_local.data_ - (long)this->buf_) < uVar3) {
    return false;
  }
  p = Reference::Indirect(&r_local);
  uVar3 = (ulong)r_local.byte_width_;
  uVar4 = (long)p - (long)this->buf_;
  if (((uVar4 & uVar3 - 1) != 0) && ((this->check_alignment_ & 1U) != 0)) goto LAB_00149730;
  bVar1 = false;
  switch(r_local.type_) {
  case FBT_KEY:
    bVar1 = VerifyKey(this,p);
    return bVar1;
  case FBT_STRING:
    r_00.parent_width_ = r_local.parent_width_;
    r_00.data_ = r_local.data_;
    r_00.byte_width_ = r_local.byte_width_;
    r_00._10_2_ = r_local._10_2_;
    r_00.type_ = r_local.type_;
    bVar1 = VerifyVector(this,r_00,p,FBT_UINT);
    if (bVar1) {
      Sized::Sized((Sized *)&len,p,r_local.byte_width_);
      bVar1 = local_28 + 1 < this->size_;
      bVar6 = this->size_ - (local_28 + 1) < (ulong)(CONCAT71(uStack_37,len) - (long)this->buf_);
LAB_0014978d:
      return (bool)(!bVar6 & bVar1);
    }
    goto LAB_00149730;
  case FBT_INDIRECT_INT:
  case FBT_INDIRECT_UINT:
  case FBT_INDIRECT_FLOAT:
    return uVar4 <= this->size_ - uVar3 && uVar3 < this->size_;
  case FBT_MAP:
    r_01.parent_width_ = r_local.parent_width_;
    r_01.data_ = r_local.data_;
    r_01.byte_width_ = r_local.byte_width_;
    r_01._10_2_ = r_local._10_2_;
    r_01.type_ = r_local.type_;
    bVar1 = VerifyVector(this,r_01,p,FBT_NULL);
    if (!bVar1) {
      return false;
    }
    bVar1 = VerifyKeys(this,p,r_local.byte_width_);
    return bVar1;
  case FBT_VECTOR:
    uVar5 = CONCAT44(r_local.type_,
                     CONCAT22(r_local._10_2_,CONCAT11(r_local.byte_width_,r_local.parent_width_)));
    TVar2 = FBT_NULL;
    break;
  case FBT_VECTOR_INT:
    uVar5 = CONCAT44(r_local.type_,
                     CONCAT22(r_local._10_2_,CONCAT11(r_local.byte_width_,r_local.parent_width_)));
    TVar2 = FBT_INT;
    break;
  case FBT_VECTOR_UINT:
  case FBT_BLOB:
  case FBT_VECTOR_BOOL:
    uVar5 = CONCAT44(r_local.type_,
                     CONCAT22(r_local._10_2_,CONCAT11(r_local.byte_width_,r_local.parent_width_)));
    TVar2 = FBT_UINT;
    break;
  case FBT_VECTOR_FLOAT:
    uVar5 = CONCAT44(r_local.type_,
                     CONCAT22(r_local._10_2_,CONCAT11(r_local.byte_width_,r_local.parent_width_)));
    TVar2 = FBT_FLOAT;
    break;
  case FBT_VECTOR_KEY:
  case FBT_VECTOR_STRING_DEPRECATED:
    uVar5 = CONCAT44(r_local.type_,
                     CONCAT22(r_local._10_2_,CONCAT11(r_local.byte_width_,r_local.parent_width_)));
    TVar2 = FBT_KEY;
    break;
  case FBT_VECTOR_INT2:
  case FBT_VECTOR_UINT2:
  case FBT_VECTOR_FLOAT2:
  case FBT_VECTOR_INT3:
  case FBT_VECTOR_UINT3:
  case FBT_VECTOR_FLOAT3:
  case FBT_VECTOR_INT4:
  case FBT_VECTOR_UINT4:
  case FBT_VECTOR_FLOAT4:
    len = '\0';
    TVar2 = ToFixedTypedVectorElementType(r_local.type_,&len);
    if (TVar2 < FBT_MAX_TYPE) {
      bVar1 = (ulong)len * (ulong)r_local.byte_width_ < this->size_;
      bVar6 = this->size_ - (ulong)len * (ulong)r_local.byte_width_ <
              (ulong)((long)p - (long)this->buf_);
      goto LAB_0014978d;
    }
LAB_00149730:
    bVar1 = false;
  default:
    goto switchD_0014975b_caseD_1a;
  }
  r_02.parent_width_ = (char)uVar5;
  r_02.byte_width_ = (char)((ulong)uVar5 >> 8);
  r_02._10_2_ = (short)((ulong)uVar5 >> 0x10);
  r_02.type_ = (int)((ulong)uVar5 >> 0x20);
  r_02.data_ = r_local.data_;
  bVar1 = VerifyVector(this,r_02,p,TVar2);
switchD_0014975b_caseD_1a:
  return bVar1;
}

Assistant:

bool VerifyRef(Reference r) {
    // r.parent_width_ and r.data_ already verified.
    if (!VerifyByteWidth(r.byte_width_) || !VerifyType(r.type_)) {
      return false;
    }
    if (IsInline(r.type_)) {
      // Inline scalars, don't require further verification.
      return true;
    }
    // All remaining types are an offset.
    auto off = ReadUInt64(r.data_, r.parent_width_);
    if (!VerifyOffset(off, r.data_)) return false;
    auto p = r.Indirect();
    if (!VerifyAlignment(p, r.byte_width_)) return false;
    switch (r.type_) {
      case FBT_INDIRECT_INT:
      case FBT_INDIRECT_UINT:
      case FBT_INDIRECT_FLOAT: return VerifyFromPointer(p, r.byte_width_);
      case FBT_KEY: return VerifyKey(p);
      case FBT_MAP:
        return VerifyVector(r, p, FBT_NULL) && VerifyKeys(p, r.byte_width_);
      case FBT_VECTOR: return VerifyVector(r, p, FBT_NULL);
      case FBT_VECTOR_INT: return VerifyVector(r, p, FBT_INT);
      case FBT_VECTOR_BOOL:
      case FBT_VECTOR_UINT: return VerifyVector(r, p, FBT_UINT);
      case FBT_VECTOR_FLOAT: return VerifyVector(r, p, FBT_FLOAT);
      case FBT_VECTOR_KEY: return VerifyVector(r, p, FBT_KEY);
      case FBT_VECTOR_STRING_DEPRECATED:
        // Use of FBT_KEY here intentional, see elsewhere.
        return VerifyVector(r, p, FBT_KEY);
      case FBT_BLOB: return VerifyVector(r, p, FBT_UINT);
      case FBT_STRING:
        return VerifyVector(r, p, FBT_UINT) &&
               VerifyTerminator(String(p, r.byte_width_));
      case FBT_VECTOR_INT2:
      case FBT_VECTOR_UINT2:
      case FBT_VECTOR_FLOAT2:
      case FBT_VECTOR_INT3:
      case FBT_VECTOR_UINT3:
      case FBT_VECTOR_FLOAT3:
      case FBT_VECTOR_INT4:
      case FBT_VECTOR_UINT4:
      case FBT_VECTOR_FLOAT4: {
        uint8_t len = 0;
        auto vtype = ToFixedTypedVectorElementType(r.type_, &len);
        if (!VerifyType(vtype)) return false;
        return VerifyFromPointer(p, static_cast<size_t>(r.byte_width_) * len);
      }
      default: return false;
    }
  }